

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void capnp::_::WireHelpers::transferPointer
               (SegmentBuilder *dstSegment,WirePointer *dst,SegmentBuilder *srcSegment,
               WirePointer *src)

{
  Fault srcTag;
  bool bVar1;
  word *srcPtr;
  Fault local_30;
  Fault f;
  WirePointer *src_local;
  SegmentBuilder *srcSegment_local;
  WirePointer *dst_local;
  SegmentBuilder *dstSegment_local;
  
  f.exception = (Exception *)src;
  bVar1 = WirePointer::isNull(dst);
  if (bVar1) {
    bVar1 = WirePointer::isNull((WirePointer *)f.exception);
    if (bVar1) {
      zeroMemory(dst);
    }
    else {
      bVar1 = WirePointer::isPositional((WirePointer *)f.exception);
      srcTag = f;
      if (bVar1) {
        srcPtr = WirePointer::target((WirePointer *)f.exception);
        transferPointer(dstSegment,dst,srcSegment,(WirePointer *)srcTag.exception,srcPtr);
      }
      else {
        copyMemory<capnp::_::WirePointer>(dst,(WirePointer *)f.exception);
      }
    }
    return;
  }
  kj::_::Debug::Fault::Fault
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0x3ff,FAILED,"dst->isNull()","");
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

static void transferPointer(SegmentBuilder* dstSegment, WirePointer* dst,
                              SegmentBuilder* srcSegment, WirePointer* src) {
    // Make *dst point to the same object as *src.  Both must reside in the same message, but can
    // be in different segments.  Not always-inline because this is rarely used.
    //
    // Caller MUST zero out the source pointer after calling this, to make sure no later code
    // mistakenly thinks the source location still owns the object.  transferPointer() doesn't do
    // this zeroing itself because many callers transfer several pointers in a loop then zero out
    // the whole section.

    KJ_DASSERT(dst->isNull());
    // We expect the caller to ensure the target is already null so won't leak.

    if (src->isNull()) {
      zeroMemory(dst);
    } else if (src->isPositional()) {
      transferPointer(dstSegment, dst, srcSegment, src, src->target());
    } else {
      // Far and other pointers are position-independent, so we can just copy.
      copyMemory(dst, src);
    }
  }